

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O1

shared_ptr<minja::Expression> __thiscall minja::Parser::parseMathMulDiv(Parser *this)

{
  string *__return_storage_ptr__;
  element_type *peVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  long lVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  runtime_error *prVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  Parser *pPVar12;
  Expression *__tmp;
  BinaryOpExpr *this_00;
  Parser *in_RSI;
  Op o;
  bool bVar13;
  shared_ptr<minja::Expression> sVar14;
  shared_ptr<minja::Expression> left;
  vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
  parts;
  shared_ptr<minja::Expression> right;
  string op_str;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [40];
  Parser *local_60;
  _func_int **local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_60 = this;
  parseMathUnaryPlusMinus((Parser *)local_b8);
  if ((BinaryOpExpr *)local_b8._0_8_ == (BinaryOpExpr *)0x0) {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"Expected left side of \'math mul/div\' expression");
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (parseMathMulDiv()::mul_div_tok_abi_cxx11_ == '\0') {
    iVar6 = __cxa_guard_acquire(&parseMathMulDiv()::mul_div_tok_abi_cxx11_);
    if (iVar6 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&parseMathMulDiv()::mul_div_tok_abi_cxx11_,"\\*\\*?|//?|%(?!\\})",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &parseMathMulDiv()::mul_div_tok_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parseMathMulDiv()::mul_div_tok_abi_cxx11_);
    }
  }
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  __return_storage_ptr__ = (string *)(local_b8 + 0x10);
  local_58 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00293f10;
  while( true ) {
    consumeToken(__return_storage_ptr__,in_RSI,&parseMathMulDiv()::mul_div_tok_abi_cxx11_,Strip);
    lVar7 = std::__cxx11::string::operator=((string *)&local_50,(string *)__return_storage_ptr__);
    lVar7 = *(long *)(lVar7 + 8);
    if ((element_type *)local_a8._0_8_ != (element_type *)(local_a8 + 0x10)) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._0_8_ + 1));
    }
    if (lVar7 == 0) break;
    parseMathUnaryPlusMinus((Parser *)(local_98 + 0x10));
    if (local_88._0_8_ == 0) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar10,"Expected right side of \'math mul/div\' expression");
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar6 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar6 == 0) {
      o = Mul;
    }
    else {
      iVar6 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar6 == 0) {
        o = MulMul;
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)&local_50);
        if (iVar6 == 0) {
          o = Div;
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)&local_50);
          o = Mod - (iVar6 == 0);
        }
      }
    }
    local_a8._0_8_ =
         (in_RSI->template_str).
         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_a8._8_8_ =
         (in_RSI->template_str).
         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_)->_M_use_count + 1;
      }
    }
    local_98._0_8_ = (in_RSI->it)._M_current + -(long)(in_RSI->start)._M_current;
    p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
    p_Var8->_M_use_count = 1;
    p_Var8->_M_weak_count = 1;
    p_Var8->_vptr__Sp_counted_base = local_58;
    this_00 = (BinaryOpExpr *)(p_Var8 + 1);
    BinaryOpExpr::BinaryOpExpr
              (this_00,(Location *)__return_storage_ptr__,(shared_ptr<minja::Expression> *)local_b8,
               (shared_ptr<minja::Expression> *)(local_98 + 0x10),o);
    uVar4 = local_b8._8_8_;
    bVar13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_b8._0_8_ = this_00;
    local_b8._8_8_ = p_Var8;
    if (bVar13) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
    }
  }
  local_88._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_88 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_98 + 0x10),"|","");
  consumeToken((string *)(local_b8 + 0x10),in_RSI,(string *)(local_98 + 0x10),Strip);
  uVar4 = local_a8._8_8_;
  _Var11._M_pi = extraout_RDX;
  if ((element_type *)local_a8._0_8_ != (element_type *)(local_a8 + 0x10)) {
    operator_delete((void *)local_a8._0_8_,(ulong)(local_98._0_8_ + 1));
    _Var11._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_88 + 0x10)) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    _Var11._M_pi = extraout_RDX_01;
  }
  uVar5 = local_b8._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (local_60->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (local_60->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)local_b8._0_8_;
    (local_60->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
    local_b8._0_8_ = (BinaryOpExpr *)0x0;
    pPVar12 = local_60;
  }
  else {
    parseMathMulDiv((Parser *)(local_98 + 0x10));
    pPVar12 = local_60;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      lVar7 = 0;
    }
    else {
      lVar7 = __dynamic_cast(local_88._0_8_,&Expression::typeinfo,&FilterExpr::typeinfo,0);
    }
    if (lVar7 == 0) {
      local_a8._0_8_ = (_func_int **)0x0;
      local_a8._8_8_ = (char *)0x0;
      local_98._0_8_ = (_func_int **)0x0;
      std::
      vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>
      ::emplace_back<std::shared_ptr<minja::Expression>>
                ((vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>
                  *)(local_b8 + 0x10),(shared_ptr<minja::Expression> *)local_b8);
      std::
      vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>
      ::emplace_back<std::shared_ptr<minja::Expression>>
                ((vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>
                  *)(local_b8 + 0x10),(shared_ptr<minja::Expression> *)(local_98 + 0x10));
      peVar1 = (in_RSI->template_str).
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      p_Var8 = (in_RSI->template_str).
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        }
      }
      pcVar2 = (in_RSI->it)._M_current;
      pcVar3 = (in_RSI->start)._M_current;
      p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
      pPVar12 = local_60;
      p_Var9->_M_use_count = 1;
      p_Var9->_M_weak_count = 1;
      p_Var9->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00293e98;
      p_Var9[1]._vptr__Sp_counted_base = (_func_int **)&PTR___cxa_pure_virtual_002939e0;
      *(element_type **)&p_Var9[1]._M_use_count = peVar1;
      p_Var9[2]._vptr__Sp_counted_base = (_func_int **)p_Var8;
      if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        }
      }
      *(long *)&p_Var9[2]._M_use_count = (long)pcVar2 - (long)pcVar3;
      p_Var9[1]._vptr__Sp_counted_base = (_func_int **)&PTR_do_evaluate_00293ee8;
      p_Var9[3]._vptr__Sp_counted_base = (_func_int **)local_a8._0_8_;
      p_Var9[3]._M_use_count = local_a8._8_4_;
      p_Var9[3]._M_weak_count = local_a8._12_4_;
      p_Var9[4]._vptr__Sp_counted_base = (_func_int **)local_98._0_8_;
      local_a8._0_8_ = (element_type *)0x0;
      local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_98._0_8_ = (char *)0x0;
      (local_60->template_str).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)(p_Var9 + 1);
      (local_60->template_str).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = p_Var9;
      if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
      }
      std::
      vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
      ::~vector((vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                 *)(local_b8 + 0x10));
      _Var11._M_pi = extraout_RDX_03;
    }
    else {
      std::
      vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
      ::_M_insert_rval((vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                        *)(lVar7 + 0x20),*(shared_ptr<minja::Expression> **)(lVar7 + 0x20),
                       (value_type *)local_b8);
      uVar4 = local_88._8_8_;
      (pPVar12->template_str).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (pPVar12->template_str).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_88._0_8_;
      (pPVar12->template_str).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
      local_88._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      _Var11._M_pi = extraout_RDX_02;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
      _Var11._M_pi = extraout_RDX_04;
    }
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    _Var11._M_pi = extraout_RDX_05;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
    _Var11._M_pi = extraout_RDX_06;
  }
  sVar14.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var11._M_pi;
  sVar14.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pPVar12;
  return (shared_ptr<minja::Expression>)
         sVar14.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expression> parseMathMulDiv() {
        auto left = parseMathUnaryPlusMinus();
        if (!left) throw std::runtime_error("Expected left side of 'math mul/div' expression");

        static std::regex mul_div_tok(R"(\*\*?|//?|%(?!\}))");
        std::string op_str;
        while (!(op_str = consumeToken(mul_div_tok)).empty()) {
            auto right = parseMathUnaryPlusMinus();
            if (!right) throw std::runtime_error("Expected right side of 'math mul/div' expression");
            auto op = op_str == "*" ? BinaryOpExpr::Op::Mul
                : op_str == "**" ? BinaryOpExpr::Op::MulMul
                : op_str == "/" ? BinaryOpExpr::Op::Div
                : op_str == "//" ? BinaryOpExpr::Op::DivDiv
                : BinaryOpExpr::Op::Mod;
            left = std::make_shared<BinaryOpExpr>(get_location(), std::move(left), std::move(right), op);
        }

        if (!consumeToken("|").empty()) {
            auto expr = parseMathMulDiv();
            if (auto filter = dynamic_cast<FilterExpr*>(expr.get())) {
                filter->prepend(std::move(left));
                return expr;
            } else {
                std::vector<std::shared_ptr<Expression>> parts;
                parts.emplace_back(std::move(left));
                parts.emplace_back(std::move(expr));
                return std::make_shared<FilterExpr>(get_location(), std::move(parts));
            }
        }
        return left;
    }